

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

command_node * __thiscall
libchars::command_node::add_node
          (command_node *this,command_node *parent,string *part,filter_t mask_,bool hidden_)

{
  command_node *this_00;
  command_node *local_70;
  command_node *n;
  bool hidden__local;
  filter_t mask__local;
  string *part_local;
  command_node *parent_local;
  command_node *this_local;
  
  if (parent == (command_node *)0x0) {
    this_local = (command_node *)0x0;
  }
  else {
    this_00 = (command_node *)operator_new(0x58,(nothrow_t *)&std::nothrow);
    local_70 = (command_node *)0x0;
    if (this_00 != (command_node *)0x0) {
      command_node(this_00,part);
      local_70 = this_00;
    }
    if (local_70 != (command_node *)0x0) {
      local_70->mask = mask_;
      local_70->hidden = hidden_;
      add_node(this,parent,local_70);
    }
    this_local = local_70;
  }
  return this_local;
}

Assistant:

command_node *command_node::add_node(command_node *parent, const std::string &part, command::filter_t mask_, bool hidden_)
    {
        if (parent != NULL) {
            command_node *n = new (std::nothrow) command_node(part);
            if (n != NULL) {
                n->mask = mask_;
                n->hidden = hidden_;
                add_node(parent, n);
            }
            return n;
        }
        else {
            return NULL;
        }
    }